

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtesttostring.h
# Opt level: O0

char * QTest::toString<QModelIndex>(QModelIndex *idx)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  QAbstractItemModel *pQVar4;
  char *pcVar5;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  char msg [128];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  uVar1 = QModelIndex::row(in_RDI);
  uVar2 = QModelIndex::column(in_RDI);
  pvVar3 = QModelIndex::internalPointer(in_RDI);
  pQVar4 = QModelIndex::model((QModelIndex *)0x1a7949);
  snprintf((char *)&local_88,0x80,"QModelIndex(%d,%d,%p,%p)",(ulong)uVar1,(ulong)uVar2,pvVar3,pQVar4
          );
  pcVar5 = (char *)qstrdup((char *)&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pcVar5;
  }
  __stack_chk_fail();
}

Assistant:

inline char *toString(const QModelIndex &idx)
{
    char msg[128];
    std::snprintf(msg, sizeof(msg), "QModelIndex(%d,%d,%p,%p)",
                  idx.row(), idx.column(), idx.internalPointer(),
                  static_cast<const void*>(idx.model()));
    return qstrdup(msg);
}